

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_angleconvtest(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint ang3;
  uint ang2;
  uint local_2c;
  double dStack_28;
  uint ang1;
  double ang;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  ang._4_4_ = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  Printf("Testing degrees to angle conversion:\n");
  for (dStack_28 = -900.0; dStack_28 < 900.0; dStack_28 = dStack_28 + 45.0) {
    TAngle<double>::TAngle((TAngle<double> *)&ang3,dStack_28);
    local_2c = TAngle<double>::BAMs((TAngle<double> *)&ang3);
    Printf("Angle = %.5f: xs_RoundToInt = %08x, unsigned cast = %08x, signed cast = %08x\n",
           dStack_28,(ulong)local_2c,(long)(dStack_28 * 11930464.711111112) & 0xffffffff,
           (ulong)(uint)(int)(dStack_28 * 11930464.711111112));
  }
  return;
}

Assistant:

CCMD(angleconvtest)
{
	Printf("Testing degrees to angle conversion:\n");
	for (double ang = -5 * 180.; ang < 5 * 180.; ang += 45.)
	{
		unsigned ang1 = DAngle(ang).BAMs();
		unsigned ang2 = (unsigned)(ang * (0x40000000 / 90.));
		unsigned ang3 = (unsigned)(int)(ang * (0x40000000 / 90.));
		Printf("Angle = %.5f: xs_RoundToInt = %08x, unsigned cast = %08x, signed cast = %08x\n",
			ang, ang1, ang2, ang3);
	}
}